

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O2

void ctor_suite::construct_unsigned_long_long_int(void)

{
  undefined1 local_3a;
  undefined1 local_39;
  variable data;
  
  data.storage.current = '\v';
  data.storage.storage._0_8_ = 0;
  local_39 = 1;
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.same<unsigned long long int>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x6b,"void ctor_suite::construct_unsigned_long_long_int()",&local_39,&local_3a);
  local_39 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                       (&data);
  local_3a = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<integer>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x6c,"void ctor_suite::construct_unsigned_long_long_int()",&local_39,&local_3a);
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_max_align_t,_unsigned_char,_trial::dynamic::nullable,_bool,_signed_char,_unsigned_char,_short,_unsigned_short,_int,_unsigned_int,_long,_unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>,_std::map<trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>,_std::less<trial::dynamic::basic_variable<std::allocator<char>_>_>,_std::allocator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>_>
  ::~small_union(&data.storage);
  return;
}

Assistant:

void construct_u16string()
{
    {
        variable data(u"charlie");
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
    }
    {
        variable data(std::u16string(u"charlie"));
        TRIAL_PROTOCOL_TEST_EQUAL(data.is<u16string>(), true);
    }
}